

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

bool __thiscall OpenMD::StringTokenizer::nextTokenAsBool(StringTokenizer *this)

{
  bool bVar1;
  long *plVar2;
  ostream *poVar3;
  bool result;
  istringstream iss;
  string token;
  bool local_1bd [13];
  istringstream local_1b0 [104];
  StringTokenizer *in_stack_fffffffffffffeb8;
  string local_30 [47];
  byte local_1;
  
  nextToken_abi_cxx11_(in_stack_fffffffffffffeb8);
  std::__cxx11::istringstream::istringstream(local_1b0,local_30,_S_in);
  plVar2 = (long *)std::istream::operator>>(local_1b0,local_1bd);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if (bVar1) {
    local_1 = local_1bd[0] & 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"unable to convert ");
    poVar3 = std::operator<<(poVar3,local_30);
    poVar3 = std::operator<<(poVar3," to a bool");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool StringTokenizer::nextTokenAsBool() {
    std::string token = nextToken();
    std::istringstream iss(token);
    bool result;

    if (iss >> result) {
      return result;
    } else {
      std::cerr << "unable to convert " << token << " to a bool" << std::endl;
      return false;
    }
  }